

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalmanPos.cpp
# Opt level: O2

void __thiscall KalmanFilterPos::predict(KalmanFilterPos *this,double dt)

{
  MatrixXd *this_00;
  undefined1 auVar1 [16];
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  Rhs local_178;
  Lhs local_170;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  double local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  double local_80;
  double local_78;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_70;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_58;
  
  local_170.m_rhs = local_170.m_lhs;
  this_00 = &this->F;
  local_70.m_lhs.m_lhs = (LhsNested)0x3ff0000000000000;
  local_78 = dt;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_58,this_00,
             (Scalar *)&local_70);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_170.m_rhs;
  local_170 = (Lhs)(auVar1 << 0x40);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_58,
                      (Scalar *)&local_170);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_78);
  local_178.m_matrix = (non_const_type)0x0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&local_178);
  local_80 = local_78 * 0.5 * local_78;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_80);
  local_88 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_88);
  local_90 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_90);
  local_98 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_98);
  local_a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_78);
  local_a8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a8);
  local_b0 = local_78 * 0.5 * local_78;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b0);
  local_b8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b8);
  local_c0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_c0);
  local_c8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_c8);
  local_d0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_d0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_78);
  local_d8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_d8);
  local_e0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_e0);
  local_e8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_e8);
  local_f0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_f0);
  local_f8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_f8);
  local_100 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_100);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_78);
  local_108 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_108);
  local_110 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_110);
  local_118 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_118);
  local_120 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_120);
  local_128 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_128);
  local_130 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_130);
  local_138 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_138);
  local_140 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_140);
  local_148 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_148);
  local_150 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_150);
  local_158 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_158);
  local_160 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_160);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_58);
  local_58.m_lhs.m_lhs =
       (LhsNested)
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                  (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            (&this->x,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)&local_58);
  local_170 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P);
  local_178.m_matrix = this_00;
  Eigen::
  Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
  ::Product(&local_70,&local_170,&local_178);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,0>>
  ::operator+(&local_58,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
               *)&local_70,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Q);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            (&this->P,&local_58);
  return;
}

Assistant:

void KalmanFilterPos::predict(double dt){
    F<<1.0,0,dt,0,0.5*dt*dt,0,
    0,1.0,0,dt,0,0.5*dt*dt,
    0,0,1.0,0,dt,0,
    0,0,0,1.0,0,dt,
    0,0,0,0,1.0,0,
    0,0,0,0,0,1.0;
    x = F*x;
    P = F*P*F.transpose()+Q;
}